

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall
TimerTest_scopedWithIterationsCancel_Test::TestBody(TimerTest_scopedWithIterationsCancel_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c8 [8];
  Message local_c0 [12];
  future_status local_b4;
  promise<void> local_b0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  anon_class_16_2_80250b70 local_78;
  function<void_(jessilib::timer_&)> local_68;
  undefined8 local_48;
  undefined1 local_40 [8];
  timer timer_obj;
  promise<void> promise;
  size_t iterations;
  TimerTest_scopedWithIterationsCancel_Test *this_local;
  
  promise._M_storage._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter,_true,_true>
        )(__uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
          )0x0;
  this_00 = &timer_obj.m_context.
             super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::promise<void>::promise((promise<void> *)this_00);
  local_48 = 1000000;
  local_78.iterations = (size_t *)&promise._M_storage;
  local_78.promise = (promise<void> *)this_00;
  std::function<void(jessilib::timer&)>::
  function<TimerTest_scopedWithIterationsCancel_Test::TestBody()::__0,void>
            ((function<void(jessilib::timer&)> *)&local_68,&local_78);
  jessilib::timer::timer((timer *)local_40,local_48,4,&local_68);
  std::function<void_(jessilib::timer_&)>::~function(&local_68);
  std::promise<void>::get_future(&local_b0);
  local_b0._M_storage._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl._4_4_ =
       std::__basic_future<void>::wait_for<long,std::ratio<1l,1000000000l>>
                 ((__basic_future<void> *)&local_b0,&timeout);
  local_b4 = ready;
  testing::internal::EqHelper::Compare<std::future_status,_std::future_status,_nullptr>
            ((EqHelper *)local_98,"promise.get_future().wait_for(timeout)",
             "std::future_status::ready",
             (future_status *)
             ((long)&local_b0._M_storage._M_t.
                     super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
             + 4),&local_b4);
  std::future<void>::~future((future<void> *)&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  jessilib::timer::~timer((timer *)local_40);
  std::promise<void>::~promise
            ((promise<void> *)
             &timer_obj.m_context.
              super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(TimerTest, scopedWithIterationsCancel) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	timer timer_obj{ period, total_iterations, [&iterations, &promise](timer& in_timer) {
		if (++iterations == total_iterations) {
			promise.set_value();
			in_timer.cancel();
		}
	} };

	EXPECT_EQ(promise.get_future().wait_for(timeout), std::future_status::ready);
}